

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_pixmap.cxx
# Opt level: O1

int fl_draw_pixmap(char **cdata,int x,int y,Fl_Color bg)

{
  uchar **ppuVar1;
  int iVar2;
  int iVar3;
  uchar *out;
  byte *pbVar4;
  uchar *puVar5;
  int iVar6;
  byte bVar7;
  int w;
  int h;
  
  iVar2 = fl_measure_pixmap(cdata,&w,&h);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    out = (uchar *)operator_new__((long)(w * h * 4));
    iVar3 = fl_convert_pixmap(cdata,out,bg);
    iVar2 = h;
    ppuVar1 = fl_mask_bitmap;
    if (iVar3 == 0) {
      iVar2 = 0;
    }
    else {
      if (fl_mask_bitmap != (uchar **)0x0) {
        iVar3 = w + 0xe;
        if (-1 < w + 7) {
          iVar3 = w + 7;
        }
        pbVar4 = (byte *)operator_new__((long)((iVar3 >> 3) * h));
        *ppuVar1 = pbVar4;
        if (0 < iVar2) {
          puVar5 = out + 3;
          iVar2 = 0;
          do {
            if (0 < w) {
              iVar6 = 0;
              iVar3 = 1;
              bVar7 = 0;
              do {
                bVar7 = (char)*puVar5 >> 7 & (byte)iVar3 | bVar7;
                iVar3 = iVar3 * 2;
                if (iVar6 == w + -1 || 0x80 < iVar3) {
                  *pbVar4 = bVar7;
                  pbVar4 = pbVar4 + 1;
                  iVar3 = 1;
                  bVar7 = 0;
                }
                iVar6 = iVar6 + 1;
                puVar5 = puVar5 + 4;
              } while (iVar6 < w);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < h);
        }
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2f])
                (fl_graphics_driver,out,x,(ulong)(uint)y,(ulong)(uint)w,(ulong)(uint)h,4,0);
      iVar2 = 1;
    }
    operator_delete__(out);
  }
  return iVar2;
}

Assistant:

int fl_draw_pixmap(const char*const* cdata, int x, int y, Fl_Color bg) {
  int w, h;

  if (!fl_measure_pixmap(cdata, w, h))
    return 0;

  uchar *buffer = new uchar[w*h*4];

  if (!fl_convert_pixmap(cdata, buffer, bg)) {
    delete[] buffer;
    return 0;
  }

  // FIXME: Hack until fl_draw_image() supports alpha properly
#ifdef  __APPLE_QUARTZ__
  if (Fl_Surface_Device::surface() == Fl_Display_Device::display_device()) {
    Fl_RGB_Image* rgb = new Fl_RGB_Image(buffer, w, h, 4);
    rgb->alloc_array = 1;
    rgb->draw(x, y);
    delete rgb;
    return 1;
  } else {
#endif // __APPLE_QUARTZ__
  // build the mask bitmap used by Fl_Pixmap:
  if (fl_mask_bitmap) {
    int W = (w+7)/8;
    uchar* bitmap = new uchar[W * h];
    *fl_mask_bitmap = bitmap;
    const uchar *p = &buffer[3];
    uchar b = 0;
    for (int Y = 0; Y < h; Y++) {
      b = 0;
      for (int X = 0, bit = 1; X < w; X++, p += 4) {
        if (*p > 127)
          b |= bit;
	    bit <<= 1;
        if (bit > 0x80 || X == w-1) {
	    *bitmap++ = b;
          bit = 1;
	    b = 0;
	  }
      } // if chars_per_pixel
    } // for Y
  }

  fl_draw_image(buffer, x, y, w, h, 4);

#ifdef __APPLE_QUARTZ__
  }
#endif
  delete[] buffer;
  return 1;
}